

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeMemGetAtomicAccessAttributeExp
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,void *ptr,size_t size,
          ze_memory_atomic_attr_exp_flags_t *pAttr)

{
  _func_void__ze_mem_get_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_void_ptr_unsigned_long_uint_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  ulong *puVar5;
  unsigned_long in_RCX;
  void *in_RDX;
  long lVar6;
  _ze_device_handle_t *in_RSI;
  _ze_context_handle_t *in_RDI;
  uint *in_R8;
  ulong uVar7;
  APITracerCallbackDataImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_mem_get_atomic_access_attribute_exp_params_t tracerParams;
  uint *local_110;
  unsigned_long local_108;
  void *local_100;
  _ze_device_handle_t *local_f8;
  _ze_context_handle_t *local_f0;
  _func_void__ze_mem_get_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_e8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_e0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_c8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_a8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_90;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_78;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_68;
  _ze_mem_get_atomic_access_attribute_exp_params_t local_58;
  
  if (DAT_0017f558 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_void_ptr_unsigned_long_uint_ptr
       *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_110 = in_R8;
    local_108 = in_RCX;
    local_100 = in_RDX;
    local_f8 = in_RSI;
    local_f0 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar4 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_0017f558)(local_f0,local_f8,local_100,local_108,local_110);
      return _Var2;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar4 = '\x01';
    local_58.phContext = &local_f0;
    local_58.phDevice = &local_f8;
    local_58.pptr = &local_100;
    local_58.psize = &local_108;
    local_58.ppAttr = &local_110;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    local_e8 = (_func_void__ze_mem_get_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    vStack_e0.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
          *)0x0;
    puVar5 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar5 != (ulong *)0x0) && (*puVar5 != 0)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_68.current_api_callback =
             *(_func_void__ze_mem_get_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)(puVar5[1] + 0x560 + lVar6);
        p_Var1 = *(_func_void__ze_mem_get_atomic_access_attribute_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)(puVar5[1] + 3000 + lVar6);
        local_68.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        if (vStack_e0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            vStack_e0.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
                      *)&vStack_e0,
                     (iterator)
                     vStack_e0.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          (vStack_e0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               local_68.current_api_callback;
          (vStack_e0.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_68.pUserData;
          vStack_e0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               vStack_e0.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_78.pUserData = *(void **)(puVar5[1] + 0xcb0 + lVar6);
        local_78.current_api_callback = p_Var1;
        if (local_c8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
        }
        else {
          (local_c8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
          (local_c8.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_78.pUserData;
          local_c8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0xcb8;
      } while (uVar7 < *puVar5);
    }
    p_Var1 = local_e8;
    zeApiPtr = DAT_0017f558;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_90,&vStack_e0);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_a8,&local_c8);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,void_const*,unsigned_long,unsigned_int*),_ze_mem_get_atomic_access_attribute_exp_params_t*,void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_atomic_access_attribute_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,void_const*&,unsigned_long&,unsigned_int*&>
                      (zeApiPtr,&local_58,p_Var1,&local_90,&local_a8,local_58.phContext,
                       local_58.phDevice,local_58.pptr,local_58.psize,local_58.ppAttr);
    if (local_a8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (vStack_e0.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_e0.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_e0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_e0.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_atomic_access_attribute_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetAtomicAccessAttributeExp(
        ze_context_handle_t hContext,                   ///< [in] handle of context
        ze_device_handle_t hDevice,                     ///< [in] device associated with the memory advice
        const void* ptr,                                ///< [in] Pointer to the start of the memory range
        size_t size,                                    ///< [in] Size in bytes of the memory range
        ze_memory_atomic_attr_exp_flags_t* pAttr        ///< [out] Atomic access attributes for the specified range
        )
    {
        auto pfnGetAtomicAccessAttributeExp = context.zeDdiTable.MemExp.pfnGetAtomicAccessAttributeExp;

        if( nullptr == pfnGetAtomicAccessAttributeExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.MemExp.pfnGetAtomicAccessAttributeExp, hContext, hDevice, ptr, size, pAttr);

        // capture parameters
        ze_mem_get_atomic_access_attribute_exp_params_t tracerParams = {
            &hContext,
            &hDevice,
            &ptr,
            &size,
            &pAttr
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemGetAtomicAccessAttributeExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemGetAtomicAccessAttributeExpCb_t, Mem, pfnGetAtomicAccessAttributeExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.MemExp.pfnGetAtomicAccessAttributeExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.pptr,
                                                  *tracerParams.psize,
                                                  *tracerParams.ppAttr);
    }